

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise3d.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise3D::forward
          (DeconvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  int *piVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  void *pvVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  void *pvVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  ulong uVar38;
  size_type __n;
  void *pvVar39;
  bool bVar40;
  undefined4 uVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar54;
  undefined1 auVar53 [16];
  int size;
  int size_1;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_220;
  long local_208;
  long local_1f8;
  allocator_type local_1e1;
  ulong local_1e0;
  void *local_1d8;
  ulong local_1d0;
  long local_1c8;
  void *local_1c0;
  ulong local_1b8;
  void *local_1b0;
  Mat local_1a8;
  undefined1 local_158 [16];
  Mat *local_140;
  void *local_138;
  void *local_130;
  long local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  void *local_f8;
  ulong local_f0;
  void *local_e8;
  int local_dc;
  int local_d8;
  int local_d4;
  Option *local_d0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  undefined1 local_a8 [16];
  void *local_98;
  long local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  long local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar30 = this->kernel_w;
  iVar47 = this->dilation_w;
  iVar31 = bottom_blob->w;
  iVar52 = this->stride_w;
  iVar54 = this->kernel_h;
  iVar2 = this->dilation_h;
  iVar3 = bottom_blob->h;
  iVar4 = this->stride_h;
  iVar5 = this->kernel_d;
  iVar6 = this->dilation_d;
  iVar24 = bottom_blob->d;
  iVar25 = this->stride_d;
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = bottom_blob;
  sVar10 = bottom_blob->elemsize;
  iVar29 = this->output_pad_right;
  iVar36 = this->output_pad_bottom;
  iVar7 = this->output_pad_behind;
  local_1a8.cstep = 0;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  auVar43._0_4_ = -(uint)(0 < this->pad_left);
  auVar43._4_4_ = -(uint)(0 < this->pad_right);
  auVar43._8_4_ = -(uint)(0 < this->pad_top);
  auVar43._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar22 = movmskps((int)&local_1a8 + 0x28,auVar43);
  lVar37 = 0x10;
  if (((((iVar22 == 0) && (this->pad_front < 1)) && (this->pad_behind < 1)) &&
      (((this->output_w < 1 || (this->output_h < 1)) || (this->output_d < 1)))) &&
     (lVar37 = 8, &local_1a8 != top_blob)) {
    piVar11 = top_blob->refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + 1;
      UNLOCK();
    }
    lVar37 = 8;
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_1a8.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize = top_blob->elemsize;
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar16 = top_blob->dims;
    uVar17 = top_blob->w;
    uVar18 = top_blob->h;
    uVar19 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar16;
    local_1a8.w = uVar17;
    local_1a8.h = uVar18;
    local_1a8.d = uVar19;
  }
  local_140 = top_blob;
  local_d0 = opt;
  Mat::create(&local_1a8,iVar29 + (iVar30 + -1) * iVar47 + (iVar31 + -1) * iVar52 + 1,
              iVar36 + 1 + (iVar54 + -1) * iVar2 + (iVar3 + -1) * iVar4,
              iVar7 + 1 + (iVar5 + -1) * iVar6 + (iVar24 + -1) * iVar25,this->num_output,sVar10,
              *(Allocator **)(&opt->lightmode + lVar37));
  iVar31 = local_1a8.c;
  iVar47 = local_1a8.h;
  iVar30 = local_1a8.w;
  iVar52 = -100;
  if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
    iVar52 = this->kernel_w;
    iVar54 = this->kernel_h;
    iVar2 = this->kernel_d;
    local_1c8 = (long)this->stride_w;
    iVar3 = this->stride_h;
    iVar4 = this->stride_d;
    iVar5 = this->dilation_w;
    local_118._0_4_ = this->dilation_h;
    local_158._0_4_ = this->dilation_d;
    local_138 = (void *)(ulong)(uint)this->group;
    local_1e0 = (ulong)(uint)this->activation_type;
    iVar6 = *(int *)(local_108._0_8_ + 0x38);
    uVar28 = iVar52 * iVar54 * iVar2;
    __n = (size_type)(int)uVar28;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_1e1);
    auVar50 = local_a8;
    auVar43 = local_118;
    if (0 < iVar2) {
      iVar24 = 0;
      iVar25 = 0;
      iVar29 = 0;
      do {
        if (0 < iVar54) {
          iVar36 = 0;
          do {
            if (0 < iVar52) {
              lVar37 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar24 + lVar37] = iVar25;
                iVar25 = iVar25 + iVar5;
                lVar37 = lVar37 + 1;
              } while (iVar52 != (int)lVar37);
              iVar24 = iVar24 + (int)lVar37;
            }
            iVar25 = iVar25 + (iVar30 * local_118._0_4_ - iVar5 * iVar52);
            iVar36 = iVar36 + 1;
          } while (iVar36 != iVar54);
        }
        iVar25 = iVar25 + (iVar47 * local_158._0_4_ - local_118._0_4_ * iVar54) * iVar30;
        iVar29 = iVar29 + 1;
      } while (iVar29 != iVar2);
    }
    iVar30 = (int)local_138;
    if (iVar31 == iVar30 && iVar6 == iVar30) {
      if (0 < iVar30) {
        local_e8 = *(void **)local_108._0_8_;
        local_128 = *(long *)(local_108._0_8_ + 0x10) * *(long *)(local_108._0_8_ + 0x40);
        pvVar39 = (this->weight_data).data;
        local_130 = (this->bias_data).data;
        local_120 = local_1a8.cstep * local_1a8.elemsize;
        lVar33 = (long)local_1a8.h * (long)local_1a8.w;
        lVar37 = local_1a8.elemsize * lVar33;
        local_1c0 = local_1a8.data;
        local_1d8 = (void *)0x0;
        iVar30 = (int)((lVar37 + 0xfU & 0xfffffffffffffff0) / local_1a8.elemsize);
        if (local_1a8.dims == 4) {
          iVar30 = (int)lVar33;
        }
        local_1b0 = (void *)(ulong)(uint)(iVar30 * local_1a8.d);
        local_1d0 = (ulong)(uint)(local_1a8.h * local_1a8.w * local_1a8.d);
        lVar33 = local_1a8.elemsize * (long)local_1a8.w;
        uVar23 = *(uint *)(local_108._0_8_ + 0x2c);
        local_158._0_8_ = lVar37 * iVar4;
        lVar37 = (long)local_1b0 - 1;
        uVar8 = *(uint *)(local_108._0_8_ + 0x30);
        uVar9 = *(uint *)(local_108._0_8_ + 0x34);
        local_1b8 = CONCAT71(local_1b8._1_7_,
                             (long)(this->bias_data).c * (this->bias_data).cstep == 0 ||
                             local_130 == (void *)0x0);
        local_a8._4_4_ = 0;
        local_a8._0_4_ = iVar30 * local_1a8.d + 3U & 0xfffffffc;
        local_a8._8_8_ = auVar50._8_8_;
        auVar50._8_4_ = (int)lVar37;
        auVar50._0_8_ = lVar37;
        auVar50._12_4_ = (int)((ulong)lVar37 >> 0x20);
        auVar50 = auVar50 ^ _DAT_005ef640;
        local_1f8 = (long)local_1a8.data + 0xc;
        pvVar32 = local_1a8.data;
        auVar43 = _DAT_005ef740;
        auVar51 = _DAT_005ef750;
        auVar53 = _DAT_005ef640;
        local_108 = auVar50;
        do {
          uVar41 = 0;
          if ((char)local_1b8 == '\0') {
            uVar41 = *(undefined4 *)((long)local_130 + (long)local_1d8 * 4);
          }
          if (0 < (int)local_1b0) {
            lVar37 = 0;
            do {
              auVar44._8_4_ = (int)lVar37;
              auVar44._0_8_ = lVar37;
              auVar44._12_4_ = (int)((ulong)lVar37 >> 0x20);
              auVar45 = (auVar44 | auVar51) ^ auVar53;
              iVar47 = auVar50._0_4_;
              bVar40 = iVar47 < auVar45._0_4_;
              iVar30 = auVar45._4_4_;
              iVar31 = auVar50._4_4_;
              if ((bool)(~(iVar31 < iVar30 || iVar30 == iVar31 && bVar40) & 1)) {
                *(undefined4 *)(local_1f8 + -0xc + lVar37 * 4) = uVar41;
              }
              if (iVar31 >= iVar30 && (iVar30 != iVar31 || !bVar40)) {
                *(undefined4 *)(local_1f8 + -8 + lVar37 * 4) = uVar41;
              }
              auVar45 = (auVar44 | auVar43) ^ auVar53;
              iVar30 = auVar45._4_4_;
              if (iVar30 <= iVar31 && (iVar30 != iVar31 || auVar45._0_4_ <= iVar47)) {
                *(undefined4 *)(local_1f8 + -4 + lVar37 * 4) = uVar41;
                *(undefined4 *)(local_1f8 + lVar37 * 4) = uVar41;
              }
              lVar37 = lVar37 + 4;
            } while (local_a8._0_8_ != lVar37);
          }
          if (0 < (int)uVar9) {
            pvVar26 = (void *)(local_120 * (long)local_1d8 + (long)local_1c0);
            local_118._0_8_ = pvVar26;
            local_220 = (void *)0x0;
            do {
              if (0 < (int)uVar8) {
                uVar34 = 0;
                do {
                  if (0 < (int)uVar23) {
                    uVar38 = 0;
                    do {
                      if (0 < (int)uVar28) {
                        lVar37 = uVar38 * local_1c8 * 4 +
                                 lVar33 * iVar3 * uVar34 + local_158._0_8_ * (long)local_220;
                        fVar42 = *(float *)((long)local_e8 +
                                           (long)(int)(((int)local_220 * uVar8 + (int)uVar34) *
                                                       uVar23 + (int)uVar38) * 4 +
                                           local_128 * (long)local_1d8);
                        uVar27 = 0;
                        do {
                          *(float *)((long)pvVar26 +
                                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar27] * 4 +
                                    lVar37) =
                               *(float *)((long)pvVar39 + uVar27 * 4) * fVar42 +
                               *(float *)((long)pvVar26 +
                                         (long)local_48.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[uVar27] * 4 +
                                         lVar37);
                          uVar27 = uVar27 + 1;
                        } while (uVar28 != uVar27);
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar38 != uVar23);
                  }
                  uVar34 = uVar34 + 1;
                } while (uVar34 != uVar8);
              }
              local_220 = (void *)((long)local_220 + 1);
            } while (local_220 != (void *)(ulong)uVar9);
          }
          if (0 < (int)local_1d0) {
            pfVar12 = (float *)(this->activation_params).data;
            uVar27 = 0;
            uVar34 = local_1e0;
            uVar38 = local_1d0;
            do {
              fVar42 = *(float *)((long)pvVar32 + uVar27 * 4);
              fVar49 = fVar42;
              switch((int)uVar34) {
              case 1:
                if (fVar42 <= 0.0) {
                  fVar49 = 0.0;
                }
                break;
              case 2:
                fVar49 = (float)(~-(uint)(0.0 < fVar42) & (uint)*pfVar12 |
                                -(uint)(0.0 < fVar42) & 0x3f800000) * fVar42;
                break;
              case 3:
                if (fVar42 <= *pfVar12) {
                  fVar42 = *pfVar12;
                }
                fVar49 = pfVar12[1];
                if (fVar42 <= pfVar12[1]) {
                  fVar49 = fVar42;
                }
                break;
              case 4:
                if (88.37626 <= fVar42) {
                  fVar42 = 88.37626;
                }
                fVar42 = expf((float)(-(uint)(fVar42 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar42 < -88.37626) & ((uint)fVar42 ^ auVar53._0_4_)))
                ;
                uVar34 = local_1e0;
                uVar38 = local_1d0;
                auVar50 = local_108;
                auVar43 = _DAT_005ef740;
                auVar51 = _DAT_005ef750;
                auVar53 = _DAT_005ef640;
                fVar49 = 1.0 / (fVar42 + 1.0);
                break;
              case 5:
                local_118 = ZEXT416((uint)fVar42);
                fVar42 = expf(fVar42);
                fVar42 = logf(fVar42 + 1.0);
                fVar42 = tanhf(fVar42);
                uVar34 = local_1e0;
                uVar38 = local_1d0;
                auVar50 = local_108;
                auVar43 = _DAT_005ef740;
                auVar51 = _DAT_005ef750;
                auVar53 = _DAT_005ef640;
                fVar49 = fVar42 * (float)local_118._0_4_;
                break;
              case 6:
                fVar1 = *pfVar12;
                fVar48 = (float)((uint)pfVar12[1] ^ auVar53._0_4_) / fVar1;
                fVar49 = 0.0;
                if ((fVar48 <= fVar42) && (fVar49 = fVar42, fVar42 <= fVar48 + 1.0 / fVar1)) {
                  fVar49 = (fVar1 * fVar42 + pfVar12[1]) * fVar42;
                }
              }
              *(float *)((long)pvVar32 + uVar27 * 4) = fVar49;
              uVar27 = uVar27 + 1;
            } while (uVar38 != uVar27);
          }
          local_1d8 = (void *)((long)local_1d8 + 1);
          local_1f8 = local_1f8 + local_120;
          pvVar39 = (void *)((long)pvVar39 + __n * 4);
          pvVar32 = (void *)((long)pvVar32 + local_120);
        } while (local_1d8 != local_138);
      }
    }
    else {
      uVar23 = iVar6 / iVar30;
      if (0 < iVar30) {
        uVar34 = (long)iVar31 / (long)iVar30;
        local_130 = (void *)(uVar34 & 0xffffffff);
        local_b0 = local_1a8.data;
        local_128 = local_1a8.cstep * local_1a8.elemsize;
        local_80 = (long)local_1a8.h * (long)local_1a8.w;
        local_88 = local_1a8.elemsize * local_80 + 0xf & 0xfffffffffffffff0;
        local_dc = local_1a8.dims;
        local_d8 = local_1a8.d;
        local_1b8 = (ulong)(uint)(local_1a8.h * local_1a8.w * local_1a8.d);
        local_120 = local_1a8.elemsize * local_80 * (long)iVar4;
        local_d4 = (int)uVar34;
        local_90 = (long)local_d4;
        local_78 = local_1a8.elemsize;
        lVar37 = (long)iVar3 * (long)local_1a8.w * local_1a8.elemsize;
        local_d4 = local_d4 * iVar52 * iVar54 * iVar2 * uVar23;
        local_70 = local_128 * local_90;
        local_68 = (long)(int)(uVar23 * uVar28) << 2;
        local_98 = (this->weight_data).data;
        local_b8 = (this->bias_data).data;
        uVar8 = *(uint *)(local_108._0_8_ + 0x2c);
        local_118._4_4_ = 0;
        local_118._0_4_ = *(uint *)(local_108._0_8_ + 0x30);
        local_118._8_8_ = auVar43._8_8_;
        local_1d0 = (ulong)*(uint *)(local_108._0_8_ + 0x34);
        local_c0 = (void *)((long)local_1a8.data + 0xc);
        local_f0 = 0;
        local_c8 = local_1a8.data;
        local_f8 = (void *)0x0;
        auVar43 = _DAT_005ef740;
        auVar50 = _DAT_005ef750;
        auVar51 = _DAT_005ef640;
        do {
          if (0 < (int)local_130) {
            local_220 = (void *)((long)local_98 + (long)(int)local_f0 * 4);
            bVar40 = local_b8 != (void *)0x0;
            local_50 = (long)local_f8 * local_90;
            iVar30 = (this->bias_data).c;
            sVar10 = (this->bias_data).cstep;
            iVar47 = (int)local_80;
            if (local_dc != 4) {
              iVar47 = (int)(local_88 / local_78);
            }
            local_58 = (ulong)(uint)(iVar47 * local_d8);
            iVar31 = (int)local_f8;
            local_60 = (ulong)(iVar47 * local_d8 + 3U & 0xfffffffc);
            lVar33 = local_58 - 1;
            auVar53._8_4_ = (int)lVar33;
            auVar53._0_8_ = lVar33;
            auVar53._12_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar53 = auVar53 ^ auVar51;
            local_1c0 = local_c0;
            pvVar32 = (void *)0x0;
            pvVar39 = local_c8;
            local_a8 = auVar53;
            do {
              uVar41 = 0;
              if ((long)iVar30 * sVar10 != 0 && bVar40) {
                uVar41 = *(undefined4 *)((long)local_b8 + ((long)pvVar32 + local_50) * 4);
              }
              if (0 < (int)local_58) {
                uVar34 = 0;
                do {
                  auVar45._8_4_ = (int)uVar34;
                  auVar45._0_8_ = uVar34;
                  auVar45._12_4_ = (int)(uVar34 >> 0x20);
                  auVar46 = (auVar45 | auVar50) ^ auVar51;
                  iVar52 = auVar53._0_4_;
                  bVar15 = iVar52 < auVar46._0_4_;
                  iVar47 = auVar46._4_4_;
                  iVar54 = auVar53._4_4_;
                  if ((bool)(~(iVar54 < iVar47 || iVar47 == iVar54 && bVar15) & 1)) {
                    *(undefined4 *)((long)local_1c0 + uVar34 * 4 + -0xc) = uVar41;
                  }
                  if (iVar54 >= iVar47 && (iVar47 != iVar54 || !bVar15)) {
                    *(undefined4 *)((long)local_1c0 + uVar34 * 4 + -8) = uVar41;
                  }
                  auVar45 = (auVar45 | auVar43) ^ auVar51;
                  iVar47 = auVar45._4_4_;
                  if (iVar47 <= iVar54 && (iVar47 != iVar54 || auVar45._0_4_ <= iVar52)) {
                    *(undefined4 *)((long)local_1c0 + uVar34 * 4 + -4) = uVar41;
                    *(undefined4 *)((long)local_1c0 + uVar34 * 4) = uVar41;
                  }
                  uVar34 = uVar34 + 4;
                } while (local_60 != uVar34);
              }
              if (0 < (int)local_1d0) {
                local_1d8 = (void *)(((long)pvVar32 + local_50) * local_128 + (long)local_b0);
                auVar46._8_8_ = 0;
                auVar46._0_8_ = local_158._8_8_;
                local_158 = auVar46 << 0x40;
                do {
                  if (0 < (int)local_118._0_4_) {
                    local_208 = 0;
                    do {
                      if (0 < (int)uVar8) {
                        lVar21 = *(long *)(local_108._0_8_ + 0x30);
                        lVar33 = *(long *)(local_108._0_8_ + 0x10);
                        lVar13 = *(long *)(local_108._0_8_ + 0x40);
                        lVar35 = *(int *)(local_108._0_8_ + 0x2c) * lVar33;
                        lVar14 = *(long *)local_108._0_8_;
                        uVar34 = 0;
                        do {
                          if (0 < (int)uVar23) {
                            lVar20 = uVar34 * local_1c8 * 4 +
                                     lVar37 * local_208 + local_120 * local_158._0_8_;
                            uVar38 = 0;
                            pvVar26 = local_220;
                            do {
                              if (0 < (int)uVar28) {
                                fVar42 = *(float *)(lVar35 * local_208 +
                                                    (long)(int)lVar21 * local_158._0_8_ * lVar35 +
                                                    lVar14 + uVar34 * 4 +
                                                   (uVar38 + uVar23 * iVar31) * lVar13 * lVar33);
                                uVar27 = 0;
                                do {
                                  *(float *)((long)local_1d8 +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27] *
                                            4 + lVar20) =
                                       *(float *)((long)pvVar26 + uVar27 * 4) * fVar42 +
                                       *(float *)((long)local_1d8 +
                                                 (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27] *
                                                 4 + lVar20);
                                  uVar27 = uVar27 + 1;
                                } while (uVar28 != uVar27);
                              }
                              uVar38 = uVar38 + 1;
                              pvVar26 = (void *)((long)pvVar26 + __n * 4);
                            } while (uVar38 != uVar23);
                          }
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar8);
                      }
                      local_208 = local_208 + 1;
                    } while (local_208 != local_118._0_8_);
                  }
                  uVar34 = local_158._0_8_ + 1;
                  local_158._0_8_ = uVar34;
                } while (uVar34 != local_1d0);
              }
              local_1b0 = pvVar39;
              local_e8 = pvVar32;
              if (0 < (int)local_1b8) {
                pfVar12 = (float *)(this->activation_params).data;
                uVar27 = 0;
                uVar34 = local_1e0;
                uVar38 = local_1b8;
                do {
                  fVar42 = *(float *)((long)pvVar39 + uVar27 * 4);
                  fVar49 = fVar42;
                  switch((int)uVar34) {
                  case 1:
                    if (fVar42 <= 0.0) {
                      fVar49 = 0.0;
                    }
                    break;
                  case 2:
                    fVar49 = (float)(~-(uint)(0.0 < fVar42) & (uint)*pfVar12 |
                                    -(uint)(0.0 < fVar42) & 0x3f800000) * fVar42;
                    break;
                  case 3:
                    if (fVar42 <= *pfVar12) {
                      fVar42 = *pfVar12;
                    }
                    fVar49 = pfVar12[1];
                    if (fVar42 <= pfVar12[1]) {
                      fVar49 = fVar42;
                    }
                    break;
                  case 4:
                    if (88.37626 <= fVar42) {
                      fVar42 = 88.37626;
                    }
                    fVar42 = expf((float)(-(uint)(fVar42 < -88.37626) & 0x42b0c0a5 |
                                         ~-(uint)(fVar42 < -88.37626) &
                                         ((uint)fVar42 ^ auVar51._0_4_)));
                    uVar34 = local_1e0;
                    pvVar39 = local_1b0;
                    uVar38 = local_1b8;
                    auVar43 = _DAT_005ef740;
                    auVar50 = _DAT_005ef750;
                    auVar51 = _DAT_005ef640;
                    auVar53 = local_a8;
                    fVar49 = 1.0 / (fVar42 + 1.0);
                    break;
                  case 5:
                    local_158 = ZEXT416((uint)fVar42);
                    fVar42 = expf(fVar42);
                    fVar42 = logf(fVar42 + 1.0);
                    fVar42 = tanhf(fVar42);
                    uVar34 = local_1e0;
                    pvVar39 = local_1b0;
                    uVar38 = local_1b8;
                    auVar43 = _DAT_005ef740;
                    auVar50 = _DAT_005ef750;
                    auVar51 = _DAT_005ef640;
                    auVar53 = local_a8;
                    fVar49 = fVar42 * (float)local_158._0_4_;
                    break;
                  case 6:
                    fVar1 = *pfVar12;
                    fVar48 = (float)((uint)pfVar12[1] ^ auVar51._0_4_) / fVar1;
                    fVar49 = 0.0;
                    if ((fVar48 <= fVar42) && (fVar49 = fVar42, fVar42 <= fVar48 + 1.0 / fVar1)) {
                      fVar49 = (fVar1 * fVar42 + pfVar12[1]) * fVar42;
                    }
                  }
                  *(float *)((long)pvVar39 + uVar27 * 4) = fVar49;
                  uVar27 = uVar27 + 1;
                } while (uVar38 != uVar27);
              }
              pvVar32 = (void *)((long)local_e8 + 1);
              local_1c0 = (void *)((long)local_1c0 + local_128);
              local_220 = (void *)((long)local_220 + local_68);
              pvVar39 = (void *)((long)pvVar39 + local_128);
            } while (pvVar32 != local_130);
          }
          local_f8 = (void *)((long)local_f8 + 1);
          local_c0 = (void *)((long)local_c0 + local_70);
          local_f0 = (ulong)(uint)((int)local_f0 + local_d4);
          local_c8 = (void *)((long)local_c8 + local_70);
        } while (local_f8 != local_138);
      }
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cut_padding(this,&local_1a8,local_140,local_d0);
    iVar52 = -100;
    if ((local_140->data != (void *)0x0) &&
       (iVar52 = -100, (long)local_140->c * local_140->cstep != 0)) {
      iVar52 = 0;
    }
  }
  piVar11 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar52;
}

Assistant:

int DeconvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extent_d = dilation_d * (kernel_d - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int outd = (d - 1) * stride_d + kernel_extent_d + output_pad_behind;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || pad_front > 0 || pad_behind > 0 || (output_w > 0 && output_h > 0 && output_d > 0))
    {
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise3d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, kernel_d, stride_w, stride_h, stride_d, dilation_w, dilation_h, dilation_d, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}